

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

shared_ptr<QSslContext>
QSslContext::sharedFromPrivateConfiguration
          (SslMode mode,QSslConfigurationPrivate *privConfiguration,
          bool allowRootCertOnDemandLoading)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SslMode in_ESI;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<QSslContext> sVar1;
  QSslConfigurationPrivate *in_stack_ffffffffffffffa8;
  element_type *configuration;
  QSslConfiguration local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  configuration = in_RDI;
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)in_RDI,in_stack_ffffffffffffffa8);
  sharedFromConfiguration(in_ESI,(QSslConfiguration *)configuration,SUB81((ulong)in_RDI >> 0x38,0));
  QSslConfiguration::~QSslConfiguration(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<QSslContext>)
           sVar1.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<QSslContext> QSslContext::sharedFromPrivateConfiguration(QSslSocket::SslMode mode, QSslConfigurationPrivate *privConfiguration,
                                                                        bool allowRootCertOnDemandLoading)
{
    return sharedFromConfiguration(mode, privConfiguration, allowRootCertOnDemandLoading);
}